

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

__m128i scale_plane_bilinear_kernel(__m128i *s,__m128i c0c1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i alVar5;
  __m128i t5;
  __m128i t4;
  __m128i t3;
  __m128i t2;
  __m128i t1;
  __m128i t0;
  __m128i k_64;
  __m128i c0c1_local;
  
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3 = pmaddubsw((undefined1  [16])*s,auVar3);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4 = pmaddubsw((undefined1  [16])s[1],auVar4);
  auVar2._8_8_ = 0x40004000400040;
  auVar2._0_8_ = 0x40004000400040;
  auVar3 = paddsw(auVar3,auVar2);
  auVar1._8_8_ = 0x40004000400040;
  auVar1._0_8_ = 0x40004000400040;
  auVar4 = paddsw(auVar4,auVar1);
  psraw(auVar3,ZEXT416(7));
  psraw(auVar4,ZEXT416(7));
  alVar5[1] = c0c1[1];
  alVar5[0] = 7;
  return alVar5;
}

Assistant:

static inline __m128i scale_plane_bilinear_kernel(const __m128i *const s,
                                                  const __m128i c0c1) {
  const __m128i k_64 = _mm_set1_epi16(1 << 6);
  const __m128i t0 = _mm_maddubs_epi16(s[0], c0c1);
  const __m128i t1 = _mm_maddubs_epi16(s[1], c0c1);
  // round and shift by 7 bit each 16 bit
  const __m128i t2 = _mm_adds_epi16(t0, k_64);
  const __m128i t3 = _mm_adds_epi16(t1, k_64);
  const __m128i t4 = _mm_srai_epi16(t2, 7);
  const __m128i t5 = _mm_srai_epi16(t3, 7);
  return _mm_packus_epi16(t4, t5);
}